

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::FieldDefinition_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  char *pcVar3;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  string value_type;
  string name;
  string key_type;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)options);
  if (!bVar1) {
    pcVar3 = "required";
    if (*(int *)&options->field_0x4c == 1) {
      pcVar3 = "optional";
    }
    pcVar5 = "repeated";
    if (*(int *)&options->field_0x4c != 3) {
      pcVar5 = pcVar3;
    }
    std::__cxx11::string::string((string *)&local_68,pcVar5,(allocator *)&local_a8);
    local_a8 = local_98;
    local_a0 = 0;
    field_00 = (FieldDescriptor *)0x0;
    local_98[0] = 0;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
    pFVar4 = extraout_RDX_01;
    if (TVar2 == TYPE_ENUM) {
LAB_002581ec:
      RelativeTypeName_abi_cxx11_(&local_48,(_anonymous_namespace_ *)options,pFVar4);
LAB_002581f9:
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
      pFVar4 = extraout_RDX_02;
      if (TVar2 == TYPE_MESSAGE) goto LAB_002581ec;
      TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
      if (TVar2 != TYPE_GROUP) {
        ProtoTypeName_abi_cxx11_(&local_48,this,options,field_00);
        goto LAB_002581f9;
      }
      std::__cxx11::string::assign((char *)&local_a8);
      FieldDescriptor::message_type((FieldDescriptor *)options);
    }
    std::__cxx11::string::_M_assign((string *)&local_88);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"%s %s %s = %d;",local_68._M_dataplus._M_p,local_a8,
               local_88._M_dataplus._M_p,
               (ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8));
    std::__cxx11::string::~string((string *)&local_88);
    goto LAB_0025829c;
  }
  options_00 = (GeneratorOptions *)anon_unknown_0::MapFieldKey((FieldDescriptor *)options);
  options_01 = (GeneratorOptions *)anon_unknown_0::MapFieldValue((FieldDescriptor *)options);
  ProtoTypeName_abi_cxx11_(&local_68,this,options_00,field);
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  TVar2 = FieldDescriptor::type((FieldDescriptor *)options_01);
  pFVar4 = extraout_RDX;
  if (TVar2 == TYPE_ENUM) {
LAB_00258166:
    RelativeTypeName_abi_cxx11_(&local_88,(_anonymous_namespace_ *)options_01,pFVar4);
  }
  else {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options_01);
    pFVar4 = extraout_RDX_00;
    if (TVar2 == TYPE_MESSAGE) goto LAB_00258166;
    ProtoTypeName_abi_cxx11_(&local_88,this,options_01,field);
  }
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  StringPrintf_abi_cxx11_
            (__return_storage_ptr__,"map<%s, %s> %s = %d;",local_68._M_dataplus._M_p,local_a8,
             *(undefined8 *)(options->output_dir)._M_dataplus._M_p,
             (ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8));
LAB_0025829c:
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

string FieldDefinition(const GeneratorOptions& options,
                       const FieldDescriptor* field) {
  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    string key_type = ProtoTypeName(options, key_field);
    string value_type;
    if (value_field->type() == FieldDescriptor::TYPE_ENUM ||
        value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      value_type = RelativeTypeName(value_field);
    } else {
      value_type = ProtoTypeName(options, value_field);
    }
    return StringPrintf("map<%s, %s> %s = %d;",
                        key_type.c_str(),
                        value_type.c_str(),
                        field->name().c_str(),
                        field->number());
  } else {
    string qualifier = field->is_repeated() ? "repeated" :
        (field->is_optional() ? "optional" : "required");
    string type, name;
    if (field->type() == FieldDescriptor::TYPE_ENUM ||
        field->type() == FieldDescriptor::TYPE_MESSAGE) {
      type = RelativeTypeName(field);
      name = field->name();
    } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
      type = "group";
      name = field->message_type()->name();
    } else {
      type = ProtoTypeName(options, field);
      name = field->name();
    }
    return StringPrintf("%s %s %s = %d;",
                        qualifier.c_str(),
                        type.c_str(),
                        name.c_str(),
                        field->number());
  }
}